

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O0

int ggml_backend_sched_backend_from_buffer
              (ggml_backend_sched_t sched,ggml_tensor *tensor,ggml_tensor *op)

{
  _Bool _Var1;
  long in_RSI;
  long in_RDI;
  int i;
  ggml_backend_buffer_t buffer;
  ggml_tensor *op_00;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar2;
  
  if (*(long *)(in_RSI + 0xe8) == 0) {
    op_00 = *(ggml_tensor **)(in_RSI + 8);
  }
  else {
    op_00 = *(ggml_tensor **)(*(long *)(in_RSI + 0xe8) + 8);
  }
  if (op_00 != (ggml_tensor *)0x0) {
    for (iVar2 = 0; iVar2 < *(int *)(in_RDI + 4); iVar2 = iVar2 + 1) {
      _Var1 = ggml_backend_supports_buft
                        ((ggml_backend_t)CONCAT44(iVar2,in_stack_ffffffffffffffd0),
                         (ggml_backend_buffer_type_t)op_00);
      if ((_Var1) &&
         (_Var1 = ggml_backend_supports_op
                            ((ggml_backend_t)CONCAT44(iVar2,in_stack_ffffffffffffffd0),op_00), _Var1
         )) {
        return iVar2;
      }
    }
  }
  return -1;
}

Assistant:

static int ggml_backend_sched_backend_from_buffer(ggml_backend_sched_t sched, const struct ggml_tensor * tensor, const struct ggml_tensor * op) {
    ggml_backend_buffer_t buffer = tensor->view_src ? tensor->view_src->buffer : tensor->buffer;
    if (buffer == NULL) {
        return -1;
    }

    // find highest prio backend that supports the buffer type and the op
    for (int i = 0; i < sched->n_backends; i++) {
        if (ggml_backend_supports_buft(sched->backends[i], buffer->buft) &&
            ggml_backend_supports_op(sched->backends[i], op)) {
            return i;
        }
    }

#ifndef NDEBUG
    GGML_LOG_DEBUG("%s: warning: no backend supports op %s with a weight with buffer type %s used in tensor %s, the weight will need to be copied\n",
        __func__, ggml_op_desc(tensor), ggml_backend_buffer_name(buffer), tensor->name);
#endif

    return -1;
}